

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O1

void Ptex::v2_4::(anonymous_namespace)::ApplyS<unsigned_short,3>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int nTxChan)

{
  uint *puVar1;
  float fVar2;
  byte bVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  float *pfVar7;
  uint *puVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  uint *puVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  bVar3 = (k->res).ulog2;
  iVar12 = nTxChan << (bVar3 & 0x1f);
  lVar6 = (long)iVar12 * (long)k->vw;
  if ((int)lVar6 != 0) {
    puVar8 = (uint *)((long)data + (long)(((k->v << (bVar3 & 0x1f)) + k->u) * nTxChan) * 2);
    puVar1 = (uint *)((long)puVar8 + lVar6 * 2);
    pfVar4 = k->ku;
    pfVar7 = k->kv;
    lVar11 = (long)nTxChan;
    lVar10 = k->uw * lVar11;
    iVar9 = (int)lVar10;
    lVar6 = lVar11 * 2;
    do {
      fVar17 = *pfVar4;
      fVar15 = (float)(ushort)puVar8[1] * fVar17;
      fVar16 = fVar17 * (float)(*puVar8 & 0xffff);
      fVar17 = fVar17 * (float)(*puVar8 >> 0x10);
      lVar13 = lVar10 * 2 + lVar11 * -2;
      puVar14 = puVar8;
      pfVar5 = pfVar4;
      if (iVar9 != nTxChan) {
        do {
          fVar2 = pfVar5[1];
          puVar8 = (uint *)((long)puVar14 + lVar6);
          fVar16 = fVar16 + fVar2 * (float)(*(uint *)((long)puVar14 + lVar6) & 0xffff);
          fVar17 = fVar17 + fVar2 * (float)(*(uint *)((long)puVar14 + lVar6) >> 0x10);
          fVar15 = fVar15 + (float)*(ushort *)((long)puVar14 + lVar6 + 4) * fVar2;
          lVar13 = lVar13 + lVar11 * -2;
          puVar14 = puVar8;
          pfVar5 = pfVar5 + 1;
        } while (lVar13 != 0);
      }
      fVar2 = *pfVar7;
      *(ulong *)result =
           CONCAT44(fVar2 * fVar17 + (float)((ulong)*(undefined8 *)result >> 0x20),
                    fVar2 * fVar16 + (float)*(undefined8 *)result);
      pfVar7 = pfVar7 + 1;
      result[2] = fVar15 * fVar2 + result[2];
      puVar8 = (uint *)((long)puVar8 + (long)(iVar12 - iVar9) * 2 + lVar11 * 2);
    } while (puVar8 != puVar1);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }